

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase114::run(TestCase114 *this)

{
  bool bVar1;
  bool local_2ed;
  int local_2ec;
  bool _kj_shouldLog_9;
  DebugExpression<unsigned_int_&> DStack_2e8;
  undefined1 local_2e0 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_9;
  bool _kj_shouldLog_8;
  DebugExpression<unsigned_int_&> DStack_2b0;
  undefined1 local_2a8 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_8;
  bool _kj_shouldLog_7;
  DebugExpression<unsigned_int_&> DStack_278;
  undefined1 local_270 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_7;
  bool _kj_shouldLog_6;
  DebugExpression<unsigned_int_&> DStack_240;
  undefined1 local_238 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_6;
  bool _kj_shouldLog_5;
  DebugExpression<unsigned_int_&> DStack_208;
  undefined1 local_200 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_5;
  bool _kj_shouldLog_4;
  DebugExpression<unsigned_int_&> DStack_1d0;
  undefined1 local_1c8 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_4;
  void *pvStack_198;
  bool _kj_shouldLog_3;
  DestructionOrderRecorder *local_190;
  DestructionOrderRecorder *local_188;
  undefined1 local_180 [8];
  DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_std::nullptr_t>
  _kjCondition_3;
  void *pvStack_150;
  bool _kj_shouldLog_2;
  DestructionOrderRecorder *local_148;
  DestructionOrderRecorder *local_140;
  undefined1 local_138 [8];
  DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_std::nullptr_t>
  _kjCondition_2;
  void *pvStack_108;
  bool _kj_shouldLog_1;
  DestructionOrderRecorder *local_100;
  DestructionOrderRecorder *local_f8;
  undefined1 local_f0 [8];
  DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_std::nullptr_t>
  _kjCondition_1;
  DestructionOrderRecorder *pDStack_c0;
  bool _kj_shouldLog;
  DestructionOrderRecorder *local_b8;
  undefined1 local_b0 [8];
  DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_kj::(anonymous_namespace)::DestructionOrderRecorder_*&>
  _kjCondition;
  undefined1 local_78 [8];
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> combined;
  DestructionOrderRecorder *ptr;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> obj3;
  undefined1 local_40 [8];
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> obj2;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> obj1;
  uint destroyed3;
  uint destroyed2;
  uint destroyed1;
  uint counter;
  TestCase114 *this_local;
  
  destroyed2 = 0;
  destroyed3 = 0;
  obj1.ptr._4_4_ = 0;
  obj1.ptr._0_4_ = 0;
  _destroyed1 = this;
  heap<kj::(anonymous_namespace)::DestructionOrderRecorder,unsigned_int&,unsigned_int&>
            ((kj *)&obj2.ptr,&destroyed2,&destroyed3);
  heap<kj::(anonymous_namespace)::DestructionOrderRecorder,unsigned_int&,unsigned_int&>
            ((kj *)local_40,&destroyed2,(uint *)((long)&obj1.ptr + 4));
  heap<kj::(anonymous_namespace)::DestructionOrderRecorder,unsigned_int&,unsigned_int&>
            ((kj *)&ptr,&destroyed2,(uint *)&obj1.ptr);
  combined.ptr = Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>::get
                           ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>
                             *)&obj2.ptr);
  mv<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>>
            ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)local_40);
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>::
  attach<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>>
            ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)> *)
             &_kjCondition.result,
             (Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)&obj2.ptr);
  mv<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>>
            ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)&ptr);
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>::
  attach<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>>
            ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)> *)local_78,
             (Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)
             &_kjCondition.result);
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)
             &_kjCondition.result);
  pDStack_c0 = Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>::get
                         ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>
                           *)local_78);
  local_b8 = (DestructionOrderRecorder *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffff40);
  kj::_::DebugExpression<kj::(anonymous_namespace)::DestructionOrderRecorder*>::operator==
            ((DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_kj::(anonymous_namespace)::DestructionOrderRecorder_*&>
              *)local_b0,
             (DebugExpression<kj::(anonymous_namespace)::DestructionOrderRecorder*> *)&local_b8,
             &combined.ptr);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b0);
  if (!bVar1) {
    _kjCondition_1._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._39_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[39],kj::_::DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder*,kj::(anonymous_namespace)::DestructionOrderRecorder*&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0x80,ERROR,"\"failed: expected \" \"combined.get() == ptr\", _kjCondition",
                 (char (*) [39])"failed: expected combined.get() == ptr",
                 (DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_kj::(anonymous_namespace)::DestructionOrderRecorder_*&>
                  *)local_b0);
      _kjCondition_1._39_1_ = 0;
    }
  }
  local_100 = Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>::get
                        ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *
                         )&obj2.ptr);
  local_f8 = (DestructionOrderRecorder *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_100);
  pvStack_108 = (void *)0x0;
  kj::_::DebugExpression<kj::(anonymous_namespace)::DestructionOrderRecorder*>::operator==
            ((DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_std::nullptr_t>
              *)local_f0,
             (DebugExpression<kj::(anonymous_namespace)::DestructionOrderRecorder*> *)&local_f8,
             &stack0xfffffffffffffef8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f0);
  if (!bVar1) {
    _kjCondition_2._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_2._39_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[39],kj::_::DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder*,decltype(nullptr)>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0x82,ERROR,"\"failed: expected \" \"obj1.get() == nullptr\", _kjCondition",
                 (char (*) [39])"failed: expected obj1.get() == nullptr",
                 (DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_std::nullptr_t>
                  *)local_f0);
      _kjCondition_2._39_1_ = 0;
    }
  }
  local_148 = Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>::get
                        ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *
                         )local_40);
  local_140 = (DestructionOrderRecorder *)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_148);
  pvStack_150 = (void *)0x0;
  kj::_::DebugExpression<kj::(anonymous_namespace)::DestructionOrderRecorder*>::operator==
            ((DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_std::nullptr_t>
              *)local_138,
             (DebugExpression<kj::(anonymous_namespace)::DestructionOrderRecorder*> *)&local_140,
             &stack0xfffffffffffffeb0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_138);
  if (!bVar1) {
    _kjCondition_3._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_3._39_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[39],kj::_::DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder*,decltype(nullptr)>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0x83,ERROR,"\"failed: expected \" \"obj2.get() == nullptr\", _kjCondition",
                 (char (*) [39])"failed: expected obj2.get() == nullptr",
                 (DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_std::nullptr_t>
                  *)local_138);
      _kjCondition_3._39_1_ = 0;
    }
  }
  local_190 = Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>::get
                        ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *
                         )&ptr);
  local_188 = (DestructionOrderRecorder *)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_190);
  pvStack_198 = (void *)0x0;
  kj::_::DebugExpression<kj::(anonymous_namespace)::DestructionOrderRecorder*>::operator==
            ((DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_std::nullptr_t>
              *)local_180,
             (DebugExpression<kj::(anonymous_namespace)::DestructionOrderRecorder*> *)&local_188,
             &stack0xfffffffffffffe68);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_180);
  if (!bVar1) {
    _kjCondition_4._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_4._39_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[39],kj::_::DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder*,decltype(nullptr)>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0x84,ERROR,"\"failed: expected \" \"obj3.get() == nullptr\", _kjCondition",
                 (char (*) [39])"failed: expected obj3.get() == nullptr",
                 (DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_std::nullptr_t>
                  *)local_180);
      _kjCondition_4._39_1_ = 0;
    }
  }
  DStack_1d0 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&destroyed3);
  _kjCondition_5._36_4_ = 0;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_1c8,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffe30,
             (int *)&_kjCondition_5.field_0x24);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1c8);
  if (!bVar1) {
    _kjCondition_5._35_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_5._35_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0x85,ERROR,"\"failed: expected \" \"destroyed1 == 0\", _kjCondition",
                 (char (*) [33])"failed: expected destroyed1 == 0",
                 (DebugComparison<unsigned_int_&,_int> *)local_1c8);
      _kjCondition_5._35_1_ = 0;
    }
  }
  DStack_208 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(uint *)((long)&obj1.ptr + 4)
                         );
  _kjCondition_6._36_4_ = 0;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_200,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffdf8,
             (int *)&_kjCondition_6.field_0x24);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_200);
  if (!bVar1) {
    _kjCondition_6._35_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_6._35_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0x86,ERROR,"\"failed: expected \" \"destroyed2 == 0\", _kjCondition",
                 (char (*) [33])"failed: expected destroyed2 == 0",
                 (DebugComparison<unsigned_int_&,_int> *)local_200);
      _kjCondition_6._35_1_ = 0;
    }
  }
  DStack_240 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(uint *)&obj1.ptr);
  _kjCondition_7._36_4_ = 0;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_238,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffdc0,
             (int *)&_kjCondition_7.field_0x24);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_238);
  if (!bVar1) {
    _kjCondition_7._35_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_7._35_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0x87,ERROR,"\"failed: expected \" \"destroyed3 == 0\", _kjCondition",
                 (char (*) [33])"failed: expected destroyed3 == 0",
                 (DebugComparison<unsigned_int_&,_int> *)local_238);
      _kjCondition_7._35_1_ = 0;
    }
  }
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>::operator=
            ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)local_78,
             (void *)0x0);
  DStack_278 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&destroyed3);
  _kjCondition_8._36_4_ = 1;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_270,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffd88,
             (int *)&_kjCondition_8.field_0x24);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_270);
  if (!bVar1) {
    _kjCondition_8._35_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_8._35_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0x8b,ERROR,"\"failed: expected \" \"destroyed1 == 1\", _kjCondition, destroyed1",
                 (char (*) [33])"failed: expected destroyed1 == 1",
                 (DebugComparison<unsigned_int_&,_int> *)local_270,&destroyed3);
      _kjCondition_8._35_1_ = 0;
    }
  }
  DStack_2b0 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(uint *)((long)&obj1.ptr + 4)
                         );
  _kjCondition_9._36_4_ = 2;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_2a8,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffd50,
             (int *)&_kjCondition_9.field_0x24);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2a8);
  if (!bVar1) {
    _kjCondition_9._35_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_9._35_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0x8c,ERROR,"\"failed: expected \" \"destroyed2 == 2\", _kjCondition, destroyed2",
                 (char (*) [33])"failed: expected destroyed2 == 2",
                 (DebugComparison<unsigned_int_&,_int> *)local_2a8,(uint *)((long)&obj1.ptr + 4));
      _kjCondition_9._35_1_ = 0;
    }
  }
  DStack_2e8 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(uint *)&obj1.ptr);
  local_2ec = 3;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_2e0,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffd18,&local_2ec);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2e0);
  if (!bVar1) {
    local_2ed = kj::_::Debug::shouldLog(ERROR);
    while (local_2ed != false) {
      kj::_::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0x8d,ERROR,"\"failed: expected \" \"destroyed3 == 3\", _kjCondition, destroyed3",
                 (char (*) [33])"failed: expected destroyed3 == 3",
                 (DebugComparison<unsigned_int_&,_int> *)local_2e0,(uint *)&obj1.ptr);
      local_2ed = false;
    }
  }
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)local_78);
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)&ptr);
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)local_40);
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)&obj2.ptr);
  return;
}

Assistant:

TEST(Memory, AttachNested) {
  uint counter = 0;
  uint destroyed1 = 0;
  uint destroyed2 = 0;
  uint destroyed3 = 0;

  auto obj1 = kj::heap<DestructionOrderRecorder>(counter, destroyed1);
  auto obj2 = kj::heap<DestructionOrderRecorder>(counter, destroyed2);
  auto obj3 = kj::heap<DestructionOrderRecorder>(counter, destroyed3);

  auto ptr = obj1.get();

  Own<DestructionOrderRecorder> combined = obj1.attach(kj::mv(obj2)).attach(kj::mv(obj3));

  KJ_EXPECT(combined.get() == ptr);

  KJ_EXPECT(obj1.get() == nullptr);
  KJ_EXPECT(obj2.get() == nullptr);
  KJ_EXPECT(obj3.get() == nullptr);
  KJ_EXPECT(destroyed1 == 0);
  KJ_EXPECT(destroyed2 == 0);
  KJ_EXPECT(destroyed3 == 0);

  combined = nullptr;

  KJ_EXPECT(destroyed1 == 1, destroyed1);
  KJ_EXPECT(destroyed2 == 2, destroyed2);
  KJ_EXPECT(destroyed3 == 3, destroyed3);
}